

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,size_t i)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  char *pcVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  long lVar13;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar38 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar39 [32];
  undefined1 auVar37 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  float fVar63;
  vfloat4 a0_1;
  undefined1 auVar64 [32];
  vfloat4 b1;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  vfloat4 a0;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 in_ZMM19 [64];
  
  pBVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar1 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar3 = (pBVar2->super_RawBufferView).ptr_ofs;
  sVar4 = (pBVar2->super_RawBufferView).stride;
  lVar14 = sVar4 * uVar1;
  lVar15 = sVar4 * (uVar1 + 1);
  lVar16 = sVar4 * (uVar1 + 2);
  lVar13 = sVar4 * (uVar1 + 3);
  fVar63 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           maxRadiusScale;
  pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           normals.items;
  pcVar6 = (pBVar5->super_RawBufferView).ptr_ofs;
  sVar4 = (pBVar5->super_RawBufferView).stride;
  auVar36 = *(undefined1 (*) [16])(pcVar6 + uVar1 * sVar4);
  auVar43._16_16_ = in_YmmResult._16_16_;
  auVar35 = *(undefined1 (*) [16])(pcVar6 + (uVar1 + 1) * sVar4);
  auVar34 = *(undefined1 (*) [16])(pcVar6 + (uVar1 + 2) * sVar4);
  auVar33 = *(undefined1 (*) [16])(pcVar6 + sVar4 * (uVar1 + 3));
  auVar37 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar14),
                          ZEXT416((uint)(fVar63 * *(float *)(pcVar3 + lVar14 + 0xc))),0x30);
  auVar30 = vinsertps_avx512f(*(undefined1 (*) [16])(pcVar3 + lVar15),
                              ZEXT416((uint)(fVar63 * *(float *)(pcVar3 + lVar15 + 0xc))),0x30);
  auVar31 = vinsertps_avx512f(*(undefined1 (*) [16])(pcVar3 + lVar16),
                              ZEXT416((uint)(fVar63 * *(float *)(pcVar3 + lVar16 + 0xc))),0x30);
  auVar32 = vinsertps_avx512f(*(undefined1 (*) [16])(pcVar3 + lVar13),
                              ZEXT416((uint)(fVar63 * *(float *)(pcVar3 + lVar13 + 0xc))),0x30);
  auVar17 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar18 = vmulps_avx512vl(auVar32,auVar17);
  auVar43._0_16_ = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
  auVar19 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar31,auVar18);
  auVar20 = vmulps_avx512vl(auVar33,auVar17);
  auVar21 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar34,auVar20);
  auVar21 = vaddps_avx512vl(auVar35,auVar21);
  auVar22 = vfmadd231ps_avx512vl(auVar21,auVar36,auVar17);
  auVar21 = vmulps_avx512vl(auVar32,auVar43._0_16_);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar21 = vfmadd231ps_avx512vl(auVar21,auVar31,auVar23);
  auVar21 = vfmadd231ps_avx512vl(auVar21,auVar30,auVar43._0_16_);
  auVar24 = vfnmadd231ps_avx512vl(auVar21,auVar37,auVar23);
  auVar29 = vshufps_avx(auVar24,auVar24,0xc9);
  auVar21 = vshufps_avx(auVar22,auVar22,0xc9);
  auVar27._0_4_ = auVar21._0_4_ * auVar24._0_4_;
  auVar27._4_4_ = auVar21._4_4_ * auVar24._4_4_;
  auVar27._8_4_ = auVar21._8_4_ * auVar24._8_4_;
  auVar27._12_4_ = auVar21._12_4_ * auVar24._12_4_;
  auVar21 = vfmsub231ps_fma(auVar27,auVar29,auVar22);
  auVar22 = vshufps_avx(auVar21,auVar21,0xc9);
  auVar21 = vdpps_avx(auVar22,auVar22,0x7f);
  auVar19 = vaddps_avx512vl(auVar30,auVar19);
  auVar19 = vfmadd231ps_avx512vl(auVar19,auVar37,auVar17);
  fVar69 = auVar21._0_4_;
  auVar40._4_28_ = auVar43._4_28_;
  auVar40._0_4_ = fVar69;
  auVar25 = vrsqrt14ss_avx512f(auVar43._0_16_,auVar40._0_16_);
  auVar26 = vmulss_avx512f(auVar25,ZEXT416(0x3fc00000));
  auVar27 = vmulss_avx512f(auVar21,ZEXT416(0xbf000000));
  auVar27 = vmulss_avx512f(auVar27,auVar25);
  auVar25 = vmulss_avx512f(auVar25,auVar25);
  auVar25 = vmulss_avx512f(auVar27,auVar25);
  auVar25 = vaddss_avx512f(auVar26,auVar25);
  auVar26 = vrcp14ss_avx512f(auVar43._0_16_,auVar40._0_16_);
  auVar27 = vmulps_avx512vl(auVar33,auVar43._0_16_);
  auVar27 = vfmadd231ps_avx512vl(auVar27,auVar34,auVar23);
  auVar27 = vfmadd231ps_avx512vl(auVar27,auVar35,auVar43._0_16_);
  auVar27 = vfnmadd231ps_avx512vl(auVar27,auVar36,auVar23);
  auVar28 = vshufps_avx512vl(auVar27,auVar27,0xc9);
  auVar28 = vmulps_avx512vl(auVar24,auVar28);
  auVar27 = vfmsub231ps_avx512vl(auVar28,auVar29,auVar27);
  auVar21 = vfnmadd213ss_avx512f(auVar21,auVar26,ZEXT416(0x40000000));
  fVar63 = auVar26._0_4_ * auVar21._0_4_;
  auVar29 = vshufps_avx(auVar19,auVar19,0xff);
  auVar25 = vbroadcastss_avx512vl(auVar25);
  auVar21 = vshufps_avx512vl(auVar27,auVar27,0xc9);
  auVar28._0_4_ = fVar69 * auVar21._0_4_;
  auVar28._4_4_ = fVar69 * auVar21._4_4_;
  auVar28._8_4_ = fVar69 * auVar21._8_4_;
  auVar28._12_4_ = fVar69 * auVar21._12_4_;
  auVar21 = vdpps_avx(auVar22,auVar21,0x7f);
  fVar69 = auVar21._0_4_;
  auVar70._0_4_ = fVar69 * auVar22._0_4_;
  auVar70._4_4_ = fVar69 * auVar22._4_4_;
  auVar70._8_4_ = fVar69 * auVar22._8_4_;
  auVar70._12_4_ = fVar69 * auVar22._12_4_;
  auVar26 = vmulps_avx512vl(auVar22,auVar25);
  auVar22 = vsubps_avx(auVar28,auVar70);
  auVar21 = vshufps_avx(auVar24,auVar24,0xff);
  auVar21 = vmulps_avx512vl(auVar21,auVar26);
  fVar65 = auVar26._0_4_ * auVar29._0_4_;
  fVar66 = auVar26._4_4_ * auVar29._4_4_;
  fVar67 = auVar26._8_4_ * auVar29._8_4_;
  fVar68 = auVar26._12_4_ * auVar29._12_4_;
  auVar26._0_4_ = fVar63 * auVar22._0_4_;
  auVar26._4_4_ = fVar63 * auVar22._4_4_;
  auVar26._8_4_ = fVar63 * auVar22._8_4_;
  auVar26._12_4_ = fVar63 * auVar22._12_4_;
  auVar71._0_4_ = auVar19._0_4_ + fVar65;
  auVar71._4_4_ = auVar19._4_4_ + fVar66;
  auVar71._8_4_ = auVar19._8_4_ + fVar67;
  auVar71._12_4_ = auVar19._12_4_ + fVar68;
  auVar22 = vmulps_avx512vl(auVar25,auVar26);
  auVar46._8_4_ = 2;
  auVar46._0_8_ = 0x200000002;
  auVar46._12_4_ = 2;
  auVar46._16_4_ = 2;
  auVar46._20_4_ = 2;
  auVar46._24_4_ = 2;
  auVar46._28_4_ = 2;
  auVar25._0_4_ = auVar22._0_4_ * auVar29._0_4_;
  auVar25._4_4_ = auVar22._4_4_ * auVar29._4_4_;
  auVar25._8_4_ = auVar22._8_4_ * auVar29._8_4_;
  auVar25._12_4_ = auVar22._12_4_ * auVar29._12_4_;
  auVar38 = vpermps_avx512vl(auVar46,ZEXT1632(auVar71));
  auVar44._16_16_ = auVar38._16_16_;
  auVar29 = vaddps_avx512vl(auVar21,auVar25);
  auVar22 = vaddps_avx512vl(auVar24,auVar29);
  auVar21 = vaddps_avx512vl(auVar31,auVar18);
  auVar21 = vfmadd231ps_avx512vl(auVar21,auVar30,auVar43._0_16_);
  auVar18 = vfmadd231ps_avx512vl(auVar21,auVar37,auVar17);
  auVar21 = vaddps_avx512vl(auVar34,auVar20);
  auVar21 = vfmadd231ps_avx512vl(auVar21,auVar35,auVar43._0_16_);
  auVar17 = vfmadd231ps_avx512vl(auVar21,auVar36,auVar17);
  auVar21 = vmulps_avx512vl(auVar32,auVar23);
  auVar21 = vfmadd231ps_avx512vl(auVar21,auVar43._0_16_,auVar31);
  auVar21 = vfnmadd231ps_avx512vl(auVar21,auVar23,auVar30);
  auVar30 = vfmadd231ps_avx512vl(auVar21,auVar43._0_16_,auVar37);
  auVar31 = vshufps_avx512vl(auVar30,auVar30,0xc9);
  auVar21 = vshufps_avx(auVar17,auVar17,0xc9);
  auVar21 = vmulps_avx512vl(auVar30,auVar21);
  auVar21 = vfmsub231ps_fma(auVar21,auVar31,auVar17);
  auVar37 = vshufps_avx(auVar21,auVar21,0xc9);
  auVar21 = vdpps_avx(auVar37,auVar37,0x7f);
  fVar63 = auVar21._0_4_;
  auVar44._0_16_ = auVar43._0_16_;
  auVar42._4_28_ = auVar44._4_28_;
  auVar42._0_4_ = fVar63;
  auVar32 = vrsqrt14ss_avx512f(auVar43._0_16_,auVar42._0_16_);
  auVar17 = vmulss_avx512f(auVar32,ZEXT416(0x3fc00000));
  auVar20 = vmulss_avx512f(auVar21,ZEXT416(0xbf000000));
  auVar20 = vmulss_avx512f(auVar20,auVar32);
  auVar32 = vmulss_avx512f(auVar20,ZEXT416((uint)(auVar32._0_4_ * auVar32._0_4_)));
  auVar72._8_4_ = 0x3eaaaaab;
  auVar72._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar72._12_4_ = 0x3eaaaaab;
  auVar22 = vmulps_avx512vl(auVar22,auVar72);
  auVar22 = vaddps_avx512vl(auVar71,auVar22);
  auVar32 = vaddss_avx512f(auVar17,auVar32);
  auVar39 = vpermps_avx512vl(auVar46,ZEXT1632(auVar22));
  auVar33 = vmulps_avx512vl(auVar33,auVar23);
  auVar34 = vfmadd231ps_avx512vl(auVar33,auVar43._0_16_,auVar34);
  auVar33 = vshufps_avx512vl(auVar18,auVar18,0xff);
  auVar32 = vbroadcastss_avx512vl(auVar32);
  auVar35 = vfnmadd231ps_avx512vl(auVar34,auVar35,auVar23);
  auVar34 = vmulps_avx512vl(auVar37,auVar32);
  auVar17 = vmulps_avx512vl(auVar33,auVar34);
  auVar36 = vfmadd231ps_avx512vl(auVar35,auVar43._0_16_,auVar36);
  auVar35 = vshufps_avx512vl(auVar36,auVar36,0xc9);
  auVar35 = vmulps_avx512vl(auVar30,auVar35);
  auVar36 = vfmsub231ps_avx512vl(auVar35,auVar31,auVar36);
  auVar36 = vshufps_avx512vl(auVar36,auVar36,0xc9);
  auVar20._0_4_ = fVar63 * auVar36._0_4_;
  auVar20._4_4_ = fVar63 * auVar36._4_4_;
  auVar20._8_4_ = fVar63 * auVar36._8_4_;
  auVar20._12_4_ = fVar63 * auVar36._12_4_;
  auVar36 = vdpps_avx(auVar37,auVar36,0x7f);
  auVar35 = vshufps_avx512vl(auVar30,auVar30,0xff);
  auVar35 = vmulps_avx512vl(auVar35,auVar34);
  auVar34 = vaddps_avx512vl(auVar18,auVar17);
  fVar63 = auVar36._0_4_;
  auVar31._0_4_ = fVar63 * auVar37._0_4_;
  auVar31._4_4_ = fVar63 * auVar37._4_4_;
  auVar31._8_4_ = fVar63 * auVar37._8_4_;
  auVar31._12_4_ = fVar63 * auVar37._12_4_;
  auVar36 = vsubps_avx(auVar20,auVar31);
  auVar37 = vrcp14ss_avx512f(auVar43._0_16_,auVar42._0_16_);
  auVar21 = vfnmadd213ss_avx512f(auVar21,auVar37,ZEXT416(0x40000000));
  fVar63 = auVar21._0_4_ * auVar37._0_4_;
  auVar21._0_4_ = auVar36._0_4_ * fVar63;
  auVar21._4_4_ = auVar36._4_4_ * fVar63;
  auVar21._8_4_ = auVar36._8_4_ * fVar63;
  auVar21._12_4_ = auVar36._12_4_ * fVar63;
  auVar36 = vmulps_avx512vl(auVar32,auVar21);
  auVar36 = vmulps_avx512vl(auVar33,auVar36);
  auVar33 = vaddps_avx512vl(auVar35,auVar36);
  auVar36 = vaddps_avx512vl(auVar30,auVar33);
  auVar35._0_4_ = auVar36._0_4_ * 0.33333334;
  auVar35._4_4_ = auVar36._4_4_ * 0.33333334;
  auVar35._8_4_ = auVar36._8_4_ * 0.33333334;
  auVar35._12_4_ = auVar36._12_4_ * 0.33333334;
  auVar21 = vsubps_avx512vl(auVar34,auVar35);
  auVar45 = vpermps_avx2(auVar46,ZEXT1632(auVar21));
  auVar40 = vpermps_avx512vl(auVar46,ZEXT1632(auVar34));
  auVar41 = vmulps_avx512vl(auVar40,bezier_basis0._3944_32_);
  auVar41 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._2788_32_,auVar45);
  auVar41 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._1632_32_,auVar39);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar43 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._476_32_,auVar38);
  auVar44 = vmaxps_avx512vl(auVar42,auVar43);
  fVar63 = bezier_basis0._8568_4_;
  fVar69 = bezier_basis0._8572_4_;
  auVar41._4_4_ = auVar40._4_4_ * fVar69;
  auVar41._0_4_ = auVar40._0_4_ * fVar63;
  fVar7 = bezier_basis0._8576_4_;
  auVar41._8_4_ = auVar40._8_4_ * fVar7;
  fVar8 = bezier_basis0._8580_4_;
  auVar41._12_4_ = auVar40._12_4_ * fVar8;
  fVar9 = bezier_basis0._8584_4_;
  auVar41._16_4_ = auVar40._16_4_ * fVar9;
  fVar10 = bezier_basis0._8588_4_;
  auVar41._20_4_ = auVar40._20_4_ * fVar10;
  fVar11 = bezier_basis0._8592_4_;
  auVar41._24_4_ = auVar40._24_4_ * fVar11;
  auVar41._28_4_ = auVar40._28_4_;
  auVar36 = vfmadd231ps_fma(auVar41,bezier_basis0._7412_32_,auVar45);
  auVar61._8_8_ = bezier_basis0._6264_8_;
  auVar61._0_8_ = bezier_basis0._6256_8_;
  auVar61._16_8_ = bezier_basis0._6272_8_;
  auVar61._24_8_ = bezier_basis0._6280_8_;
  auVar45 = vfmadd231ps_avx512vl(ZEXT1632(auVar36),auVar61,auVar39);
  auVar62._8_8_ = bezier_basis0._5108_8_;
  auVar62._0_8_ = bezier_basis0._5100_8_;
  auVar62._16_8_ = bezier_basis0._5116_8_;
  auVar62._24_8_ = bezier_basis0._5124_8_;
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar62,auVar38);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
  auVar41 = vmulps_avx512vl(auVar45,auVar46);
  auVar45 = vblendps_avx(auVar41,ZEXT832(0) << 0x20,1);
  auVar40 = vsubps_avx512vl(auVar43,auVar45);
  auVar45 = vblendps_avx(auVar41,ZEXT832(0) << 0x20,0x80);
  auVar47 = vaddps_avx512vl(auVar43,auVar45);
  auVar45 = vmaxps_avx512vl(auVar40,auVar47);
  auVar48 = vmaxps_avx512vl(auVar44,auVar45);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar41 = vpermps_avx512vl(auVar44,ZEXT1632(auVar21));
  auVar38 = vpermps_avx512vl(auVar44,ZEXT1632(auVar34));
  auVar45 = vmulps_avx512vl(auVar38,bezier_basis0._3944_32_);
  auVar49 = vfmadd231ps_avx512vl(auVar45,bezier_basis0._2788_32_,auVar41);
  auVar45._4_4_ = auVar38._4_4_ * fVar69;
  auVar45._0_4_ = auVar38._0_4_ * fVar63;
  auVar45._8_4_ = auVar38._8_4_ * fVar7;
  auVar45._12_4_ = auVar38._12_4_ * fVar8;
  auVar45._16_4_ = auVar38._16_4_ * fVar9;
  auVar45._20_4_ = auVar38._20_4_ * fVar10;
  auVar45._24_4_ = auVar38._24_4_ * fVar11;
  auVar45._28_4_ = bezier_basis0._504_4_;
  auVar35 = vfmadd231ps_fma(auVar45,bezier_basis0._7412_32_,auVar41);
  auVar51._0_4_ = auVar21._0_4_;
  auVar51._4_4_ = auVar51._0_4_;
  auVar51._8_4_ = auVar51._0_4_;
  auVar51._12_4_ = auVar51._0_4_;
  auVar51._16_4_ = auVar51._0_4_;
  auVar51._20_4_ = auVar51._0_4_;
  auVar51._24_4_ = auVar51._0_4_;
  auVar51._28_4_ = auVar51._0_4_;
  auVar45 = vbroadcastss_avx512vl(auVar34);
  auVar41 = vmulps_avx512vl(auVar45,bezier_basis0._3944_32_);
  auVar50 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._2788_32_,auVar51);
  auVar45 = vmulps_avx512vl(auVar45,bezier_basis0._8568_32_);
  auVar51 = vfmadd231ps_avx512vl(auVar45,bezier_basis0._7412_32_,auVar51);
  auVar34 = vsubps_avx512vl(auVar18,auVar17);
  auVar36 = vsubps_avx512vl(auVar30,auVar33);
  auVar33._0_4_ = auVar36._0_4_ * 0.33333334;
  auVar33._4_4_ = auVar36._4_4_ * 0.33333334;
  auVar33._8_4_ = auVar36._8_4_ * 0.33333334;
  auVar33._12_4_ = auVar36._12_4_ * 0.33333334;
  auVar36 = vsubps_avx(auVar34,auVar33);
  auVar52 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar45 = vpermps_avx512vl(auVar52,ZEXT1632(auVar36));
  auVar41 = vpermps_avx512vl(auVar52,ZEXT1632(auVar34));
  auVar38 = vmulps_avx512vl(auVar41,bezier_basis0._3944_32_);
  auVar53 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._2788_32_,auVar45);
  auVar41 = vmulps_avx512vl(auVar41,bezier_basis0._8568_32_);
  auVar54 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._7412_32_,auVar45);
  auVar45 = vpermps_avx512vl(auVar44,ZEXT1632(auVar36));
  auVar41 = vpermps_avx512vl(auVar44,ZEXT1632(auVar34));
  auVar38 = vmulps_avx512vl(auVar41,bezier_basis0._3944_32_);
  auVar55 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._2788_32_,auVar45);
  auVar38._4_4_ = auVar41._4_4_ * fVar69;
  auVar38._0_4_ = auVar41._0_4_ * fVar63;
  auVar38._8_4_ = auVar41._8_4_ * fVar7;
  auVar38._12_4_ = auVar41._12_4_ * fVar8;
  auVar38._16_4_ = auVar41._16_4_ * fVar9;
  auVar38._20_4_ = auVar41._20_4_ * fVar10;
  auVar38._24_4_ = auVar41._24_4_ * fVar11;
  auVar38._28_4_ = auVar41._28_4_;
  auVar38 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._7412_32_,auVar45);
  auVar59._0_4_ = auVar36._0_4_;
  auVar59._4_4_ = auVar59._0_4_;
  auVar59._8_4_ = auVar59._0_4_;
  auVar59._12_4_ = auVar59._0_4_;
  auVar59._16_4_ = auVar59._0_4_;
  auVar59._20_4_ = auVar59._0_4_;
  auVar59._24_4_ = auVar59._0_4_;
  auVar59._28_4_ = auVar59._0_4_;
  auVar57._0_4_ = auVar34._0_4_;
  auVar57._4_4_ = auVar57._0_4_;
  auVar57._8_4_ = auVar57._0_4_;
  auVar57._12_4_ = auVar57._0_4_;
  auVar57._16_4_ = auVar57._0_4_;
  auVar57._20_4_ = auVar57._0_4_;
  auVar57._24_4_ = auVar57._0_4_;
  auVar57._28_4_ = auVar57._0_4_;
  auVar45 = vmulps_avx512vl(auVar57,bezier_basis0._3944_32_);
  auVar56 = vfmadd231ps_avx512vl(auVar45,auVar59,bezier_basis0._2788_32_);
  auVar39._4_4_ = auVar57._0_4_ * fVar69;
  auVar39._0_4_ = auVar57._0_4_ * fVar63;
  auVar39._8_4_ = auVar57._0_4_ * fVar7;
  auVar39._12_4_ = auVar57._0_4_ * fVar8;
  auVar39._16_4_ = auVar57._0_4_ * fVar9;
  auVar39._20_4_ = auVar57._0_4_ * fVar10;
  auVar39._24_4_ = auVar57._0_4_ * fVar11;
  auVar39._28_4_ = bezier_basis0._8596_4_;
  auVar34 = vfmadd231ps_fma(auVar39,bezier_basis0._7412_32_,auVar59);
  auVar45 = vpermps_avx512vl(auVar44,ZEXT1632(auVar71));
  auVar41 = vpermps_avx512vl(auVar44,ZEXT1632(auVar22));
  auVar39 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._1632_32_,auVar41);
  auVar39 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._476_32_,auVar45);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar35),auVar61,auVar41);
  auVar41 = vmaxps_avx512vl(auVar42,auVar39);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar62,auVar45);
  auVar49 = vmulps_avx512vl(ZEXT1632(auVar36),auVar46);
  auVar64 = ZEXT832(0) << 0x20;
  auVar45 = vblendps_avx(auVar49,auVar64,1);
  auVar57 = vsubps_avx512vl(auVar39,auVar45);
  auVar45 = vblendps_avx(auVar49,auVar64,0x80);
  auVar49 = vaddps_avx512vl(auVar39,auVar45);
  auVar45 = vmaxps_avx(auVar57,auVar49);
  auVar41 = vmaxps_avx(auVar41,auVar45);
  auVar60._4_4_ = auVar71._0_4_;
  auVar60._0_4_ = auVar71._0_4_;
  auVar60._8_4_ = auVar71._0_4_;
  auVar60._12_4_ = auVar71._0_4_;
  auVar60._16_4_ = auVar71._0_4_;
  auVar60._20_4_ = auVar71._0_4_;
  auVar60._24_4_ = auVar71._0_4_;
  auVar60._28_4_ = auVar71._0_4_;
  auVar45 = vbroadcastss_avx512vl(auVar22);
  auVar50 = vfmadd231ps_avx512vl(auVar50,bezier_basis0._1632_32_,auVar45);
  auVar50 = vfmadd231ps_avx512vl(auVar50,bezier_basis0._476_32_,auVar60);
  auVar45 = vfmadd231ps_avx512vl(auVar51,auVar61,auVar45);
  auVar51 = vmaxps_avx512vl(auVar42,auVar50);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar62,auVar60);
  auVar58 = vmulps_avx512vl(auVar45,auVar46);
  auVar45 = vblendps_avx(auVar58,auVar64,1);
  auVar59 = vsubps_avx512vl(auVar50,auVar45);
  auVar45 = vblendps_avx(auVar58,auVar64,0x80);
  auVar58 = vaddps_avx512vl(auVar50,auVar45);
  auVar45 = vmaxps_avx512vl(auVar59,auVar58);
  auVar51 = vmaxps_avx512vl(auVar51,auVar45);
  auVar45 = vminps_avx512vl(auVar40,auVar47);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
  auVar40 = vminps_avx512vl(auVar47,auVar43);
  auVar60 = vminps_avx512vl(auVar40,auVar45);
  auVar45 = vminps_avx(auVar57,auVar49);
  auVar39 = vminps_avx512vl(auVar47,auVar39);
  auVar40 = vminps_avx(auVar39,auVar45);
  auVar45 = vminps_avx(auVar59,auVar58);
  auVar39 = vminps_avx512vl(auVar47,auVar50);
  auVar43 = vminps_avx(auVar39,auVar45);
  auVar36._4_4_ = fVar66;
  auVar36._0_4_ = fVar65;
  auVar36._8_4_ = fVar67;
  auVar36._12_4_ = fVar68;
  auVar36 = vsubps_avx(auVar19,auVar36);
  auVar35 = vsubps_avx(auVar24,auVar29);
  auVar58._0_4_ = auVar36._0_4_;
  auVar64._0_4_ = auVar58._0_4_ + auVar35._0_4_ * 0.33333334;
  auVar57 = ZEXT1632(CONCAT412(auVar36._12_4_ + auVar35._12_4_ * 0.33333334,
                               CONCAT48(auVar36._8_4_ + auVar35._8_4_ * 0.33333334,
                                        CONCAT44(auVar36._4_4_ + auVar35._4_4_ * 0.33333334,
                                                 auVar64._0_4_))));
  auVar45 = vpermps_avx512vl(auVar52,auVar57);
  auVar39 = vfmadd231ps_avx512vl(auVar53,bezier_basis0._1632_32_,auVar45);
  auVar45 = vfmadd231ps_avx512vl(auVar54,auVar61,auVar45);
  auVar49 = vpermps_avx512vl(auVar52,ZEXT1632(auVar36));
  auVar50 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._476_32_,auVar49);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar62,auVar49);
  auVar39 = vpermps_avx512vl(auVar44,auVar57);
  auVar49 = vfmadd231ps_avx512vl(auVar55,bezier_basis0._1632_32_,auVar39);
  auVar35 = vfmadd231ps_fma(auVar38,auVar61,auVar39);
  auVar64._4_4_ = auVar64._0_4_;
  auVar64._8_4_ = auVar64._0_4_;
  auVar64._12_4_ = auVar64._0_4_;
  auVar64._16_4_ = auVar64._0_4_;
  auVar64._20_4_ = auVar64._0_4_;
  auVar64._24_4_ = auVar64._0_4_;
  auVar64._28_4_ = auVar64._0_4_;
  auVar39 = vfmadd231ps_avx512vl(auVar56,auVar64,bezier_basis0._1632_32_);
  auVar38 = vmaxps_avx512vl(auVar42,auVar50);
  auVar52 = vmulps_avx512vl(auVar45,auVar46);
  auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar61,auVar64);
  auVar55 = ZEXT832(0) << 0x20;
  auVar45 = vblendps_avx(auVar52,auVar55,1);
  auVar61 = vsubps_avx512vl(auVar50,auVar45);
  auVar45 = vblendps_avx(auVar52,auVar55,0x80);
  auVar52 = vaddps_avx512vl(auVar50,auVar45);
  auVar45 = vmaxps_avx(auVar61,auVar52);
  auVar38 = vmaxps_avx(auVar38,auVar45);
  auVar45 = vpermps_avx512vl(auVar44,ZEXT1632(auVar36));
  auVar44 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._476_32_,auVar45);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar35),auVar62,auVar45);
  auVar58._4_4_ = auVar58._0_4_;
  auVar58._8_4_ = auVar58._0_4_;
  auVar58._12_4_ = auVar58._0_4_;
  auVar58._16_4_ = auVar58._0_4_;
  auVar58._20_4_ = auVar58._0_4_;
  auVar58._24_4_ = auVar58._0_4_;
  auVar58._28_4_ = auVar58._0_4_;
  auVar49 = vfmadd231ps_avx512vl(auVar39,auVar58,bezier_basis0._476_32_);
  auVar39 = vmaxps_avx512vl(auVar42,auVar44);
  auVar53 = vmulps_avx512vl(ZEXT1632(auVar36),auVar46);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar62,auVar58);
  auVar45 = vblendps_avx(auVar53,auVar55,1);
  auVar62 = vsubps_avx512vl(auVar44,auVar45);
  auVar45 = vblendps_avx(auVar53,auVar55,0x80);
  auVar53 = vaddps_avx512vl(auVar44,auVar45);
  auVar45 = vmaxps_avx(auVar62,auVar53);
  auVar39 = vmaxps_avx(auVar39,auVar45);
  auVar42 = vmaxps_avx512vl(auVar42,auVar49);
  auVar46 = vmulps_avx512vl(ZEXT1632(auVar36),auVar46);
  auVar45 = vblendps_avx(auVar46,auVar55,1);
  auVar54 = vsubps_avx512vl(auVar49,auVar45);
  auVar45 = vblendps_avx(auVar46,auVar55,0x80);
  auVar46 = vaddps_avx512vl(auVar49,auVar45);
  auVar45 = vmaxps_avx(auVar54,auVar46);
  auVar45 = vmaxps_avx(auVar42,auVar45);
  auVar61 = vminps_avx(auVar61,auVar52);
  auVar42 = vminps_avx512vl(auVar47,auVar50);
  auVar61 = vminps_avx(auVar42,auVar61);
  auVar62 = vminps_avx(auVar62,auVar53);
  auVar42 = vminps_avx512vl(auVar47,auVar44);
  auVar62 = vminps_avx(auVar42,auVar62);
  auVar44 = vminps_avx512vl(auVar47,auVar49);
  auVar42 = vminps_avx(auVar54,auVar46);
  auVar42 = vminps_avx(auVar44,auVar42);
  auVar44 = vshufps_avx(auVar45,auVar45,0xb1);
  auVar45 = vmaxps_avx(auVar45,auVar44);
  auVar44 = vshufpd_avx(auVar45,auVar45,5);
  auVar45 = vmaxps_avx(auVar45,auVar44);
  auVar36 = vmaxps_avx(auVar45._0_16_,auVar45._16_16_);
  auVar45 = vshufps_avx(auVar39,auVar39,0xb1);
  auVar45 = vmaxps_avx(auVar39,auVar45);
  auVar39 = vshufpd_avx(auVar45,auVar45,5);
  auVar45 = vmaxps_avx(auVar45,auVar39);
  auVar35 = vmaxps_avx(auVar45._0_16_,auVar45._16_16_);
  auVar35 = vunpcklps_avx(auVar36,auVar35);
  auVar45 = vshufps_avx(auVar38,auVar38,0xb1);
  auVar45 = vmaxps_avx(auVar38,auVar45);
  auVar38 = vshufpd_avx(auVar45,auVar45,5);
  auVar45 = vmaxps_avx(auVar45,auVar38);
  auVar36 = vmaxps_avx(auVar45._0_16_,auVar45._16_16_);
  auVar36 = vinsertps_avx(auVar35,auVar36,0x28);
  auVar45 = vshufps_avx(auVar42,auVar42,0xb1);
  auVar45 = vminps_avx(auVar42,auVar45);
  auVar38 = vshufpd_avx(auVar45,auVar45,5);
  auVar45 = vminps_avx(auVar45,auVar38);
  auVar35 = vminps_avx(auVar45._0_16_,auVar45._16_16_);
  auVar45 = vshufps_avx(auVar62,auVar62,0xb1);
  auVar45 = vminps_avx(auVar62,auVar45);
  auVar38 = vshufpd_avx(auVar45,auVar45,5);
  auVar45 = vminps_avx(auVar45,auVar38);
  auVar34 = vminps_avx(auVar45._0_16_,auVar45._16_16_);
  auVar34 = vunpcklps_avx(auVar35,auVar34);
  auVar45 = vshufps_avx(auVar61,auVar61,0xb1);
  auVar45 = vminps_avx(auVar61,auVar45);
  auVar38 = vshufpd_avx(auVar45,auVar45,5);
  auVar45 = vminps_avx(auVar45,auVar38);
  auVar35 = vminps_avx(auVar45._0_16_,auVar45._16_16_);
  auVar35 = vinsertps_avx(auVar34,auVar35,0x28);
  auVar45 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar45 = vminps_avx(auVar43,auVar45);
  auVar38 = vshufpd_avx(auVar45,auVar45,5);
  auVar45 = vminps_avx(auVar45,auVar38);
  auVar34 = vminps_avx(auVar45._0_16_,auVar45._16_16_);
  auVar45 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar45 = vminps_avx(auVar40,auVar45);
  auVar38 = vshufpd_avx(auVar45,auVar45,5);
  auVar45 = vminps_avx(auVar45,auVar38);
  auVar33 = vminps_avx(auVar45._0_16_,auVar45._16_16_);
  auVar33 = vunpcklps_avx(auVar34,auVar33);
  auVar45 = vshufps_avx(auVar60,auVar60,0xb1);
  auVar45 = vminps_avx(auVar60,auVar45);
  auVar38 = vshufpd_avx(auVar45,auVar45,5);
  auVar45 = vminps_avx(auVar45,auVar38);
  auVar34 = vminps_avx(auVar45._0_16_,auVar45._16_16_);
  auVar34 = vinsertps_avx(auVar33,auVar34,0x28);
  auVar33 = vminps_avx(auVar35,auVar34);
  auVar45 = vshufps_avx512vl(auVar51,auVar51,0xb1);
  auVar38 = vmaxps_avx512vl(auVar51,auVar45);
  auVar45 = vshufpd_avx(auVar38,auVar38,5);
  auVar45 = vmaxps_avx(auVar38,auVar45);
  auVar35 = vmaxps_avx(auVar45._0_16_,auVar45._16_16_);
  auVar45 = vshufps_avx(auVar41,auVar41,0xb1);
  auVar45 = vmaxps_avx(auVar41,auVar45);
  auVar41 = vshufpd_avx(auVar45,auVar45,5);
  auVar45 = vmaxps_avx(auVar45,auVar41);
  auVar34 = vmaxps_avx(auVar45._0_16_,auVar45._16_16_);
  auVar34 = vunpcklps_avx(auVar35,auVar34);
  auVar45 = vshufps_avx(auVar48,auVar48,0xb1);
  auVar45 = vmaxps_avx(auVar48,auVar45);
  auVar41 = vshufpd_avx(auVar45,auVar45,5);
  auVar45 = vmaxps_avx(auVar45,auVar41);
  auVar35 = vmaxps_avx(auVar45._0_16_,auVar45._16_16_);
  auVar35 = vinsertps_avx(auVar34,auVar35,0x28);
  auVar34 = vmaxps_avx(auVar36,auVar35);
  auVar37._8_4_ = 0x7fffffff;
  auVar37._0_8_ = 0x7fffffff7fffffff;
  auVar37._12_4_ = 0x7fffffff;
  auVar36 = vandps_avx(auVar33,auVar37);
  auVar35 = vandps_avx(auVar34,auVar37);
  auVar36 = vmaxps_avx(auVar36,auVar35);
  auVar35 = vmovshdup_avx(auVar36);
  auVar35 = vmaxss_avx(auVar35,auVar36);
  auVar36 = vshufpd_avx(auVar36,auVar36,1);
  auVar36 = vmaxss_avx(auVar36,auVar35);
  fVar63 = auVar36._0_4_ * 4.7683716e-07;
  auVar29._4_4_ = fVar63;
  auVar29._0_4_ = fVar63;
  auVar29._8_4_ = fVar63;
  auVar29._12_4_ = fVar63;
  aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar33,auVar29);
  (__return_storage_ptr__->lower).field_0 = aVar12;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar34._0_4_ + fVar63;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar34._4_4_ + fVar63;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar34._8_4_ + fVar63;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar34._12_4_ + fVar63;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(size_t i) const {
        return bounds(i);
      }